

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

string * to_hex_string_abi_cxx11_(string *__return_storage_ptr__,double d)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *this;
  int local_1bc;
  double dStack_1b8;
  int i;
  anon_union_8_2_94730070 v;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  double local_18;
  double d_local;
  
  local_18 = d;
  d_local = (double)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"0x");
  dStack_1b8 = local_18;
  for (local_1bc = 0; local_1bc < 8; local_1bc = local_1bc + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_190,std::hex);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    this = (void *)std::ostream::operator<<(poVar3,std::uppercase);
    std::ostream::operator<<
              (this,(uint)*(byte *)((long)&stack0xfffffffffffffe48 + (long)(7 - local_1bc)));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex_string(double d) {
    std::stringstream ss;
    ss << "0x";
    union {
        double d;
        unsigned char s[8];
    } v;
    v.d = d;
    for (int i = 0; i < 8; ++i) {
        ss << std::hex 
            << std::setw(2) 
            << std::setfill('0') 
            << std::uppercase 
            << (unsigned)v.s[7-i];
    }
    return ss.str();
}